

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall ODDLParser::Value::~Value(Value *this)

{
  Reference *this_00;
  Value *this_01;
  Reference *tmp;
  Value *this_local;
  
  if (this->m_data != (uchar *)0x0) {
    if (this->m_type == ddl_ref) {
      this_00 = (Reference *)this->m_data;
      if ((this_00 != (Reference *)0x0) && (this_00 != (Reference *)0x0)) {
        Reference::~Reference(this_00);
        operator_delete(this_00,0x10);
      }
    }
    else if (this->m_data != (uchar *)0x0) {
      operator_delete__(this->m_data);
    }
  }
  if ((this->m_next != (Value *)0x0) && (this_01 = this->m_next, this_01 != (Value *)0x0)) {
    ~Value(this_01);
    operator_delete(this_01,0x20);
  }
  return;
}

Assistant:

Value::~Value() {
    if(m_data!=ddl_nullptr) {
        if (m_type == ddl_ref ) {
            Reference *tmp = (Reference *) m_data;
            if (tmp != ddl_nullptr)
                delete tmp;
        }else
            delete[] m_data;

    }
    if(m_next!=ddl_nullptr)
        delete m_next;
}